

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

fy_anchor * fy_document_lookup_anchor_by_token(fy_document *fyd,fy_token *anchor)

{
  fy_token *fyt;
  fy_anchor *pfVar1;
  int iVar2;
  int iVar3;
  fy_anchor *pfVar4;
  fy_input *pfVar5;
  char *pcVar6;
  fy_mark *pfVar7;
  fy_anchor *pfVar8;
  size_t sVar9;
  size_t sVar10;
  fy_anchor_list *pfVar11;
  fy_anchor *pfVar12;
  size_t text_len;
  size_t anchor_len;
  size_t local_50;
  char *local_48;
  size_t local_40;
  fy_anchor *local_38;
  
  if (anchor != (fy_token *)0x0 && fyd != (fy_document *)0x0) {
    if ((fyd->axl != (fy_accel *)0x0) && (fyd->naxl != (fy_accel *)0x0)) {
      if (fyd->axl == (fy_accel *)0x0) {
        __assert_fail("fyd->axl",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                      ,0x1ba,
                      "struct fy_anchor *fy_document_accel_lookup_anchor_by_token(struct fy_document *, struct fy_token *)"
                     );
      }
      pfVar4 = (fy_anchor *)fy_accel_lookup(fyd->axl,anchor);
      if (pfVar4 == (fy_anchor *)0x0) {
        return (fy_anchor *)0x0;
      }
      if ((pfVar4->field_0x20 & 1) == 0) {
        return pfVar4;
      }
    }
    local_48 = fy_token_get_text(anchor,&local_40);
    iVar3 = 0;
    if (local_48 != (char *)0x0) {
      pfVar4 = (fy_anchor *)(fyd->anchors)._lh.next;
      pfVar11 = &fyd->anchors;
      if (pfVar4 == (fy_anchor *)0x0 || pfVar4 == (fy_anchor *)pfVar11) {
        pfVar12 = (fy_anchor *)0x0;
      }
      else {
        iVar3 = 0;
        pfVar12 = (fy_anchor *)0x0;
        do {
          pcVar6 = fy_token_get_text(pfVar4->anchor,&local_50);
          if (pcVar6 == (char *)0x0) {
            return (fy_anchor *)0x0;
          }
          if (local_40 == local_50) {
            iVar2 = bcmp(local_48,pcVar6,local_40);
            if (iVar2 == 0) {
              pfVar12 = pfVar4;
            }
            iVar3 = iVar3 + (uint)(iVar2 == 0);
          }
          pfVar8 = (fy_anchor *)(pfVar4->node).next;
          pfVar4 = (fy_anchor *)0x0;
          if (pfVar8 != (fy_anchor *)pfVar11) {
            pfVar4 = pfVar8;
          }
        } while (pfVar4 != (fy_anchor *)0x0);
      }
      if (iVar3 != 0) {
        if (iVar3 == 1) {
          return pfVar12;
        }
        pfVar4 = (fy_anchor *)(pfVar11->_lh).next;
        if (pfVar4 == (fy_anchor *)0x0 || pfVar4 == (fy_anchor *)pfVar11) {
          pfVar8 = (fy_anchor *)0x0;
        }
        else {
          pfVar8 = (fy_anchor *)0x0;
          do {
            fyt = pfVar4->anchor;
            if (fyt == (fy_token *)0x0) {
              pfVar5 = (fy_input *)0x0;
            }
            else {
              pfVar5 = (fyt->handle).fyi;
            }
            if (pfVar5 == (anchor->handle).fyi) {
              pcVar6 = fy_token_get_text(fyt,&local_50);
              if (pcVar6 == (char *)0x0) {
                return (fy_anchor *)0x0;
              }
              if ((local_40 == local_50) && (iVar3 = bcmp(local_48,pcVar6,local_40), iVar3 == 0)) {
                sVar9 = 0xffffffffffffffff;
                sVar10 = 0xffffffffffffffff;
                local_38 = pfVar8;
                if (pfVar4->anchor != (fy_token *)0x0) {
                  pfVar7 = fy_token_start_mark(pfVar4->anchor);
                  sVar10 = 0xffffffffffffffff;
                  if (pfVar7 != (fy_mark *)0x0) {
                    sVar10 = pfVar7->input_pos;
                  }
                }
                pfVar7 = fy_token_start_mark(anchor);
                if (pfVar7 != (fy_mark *)0x0) {
                  sVar9 = pfVar7->input_pos;
                }
                pfVar8 = local_38;
                if (sVar10 < sVar9) {
                  pfVar8 = pfVar4;
                }
              }
            }
            pfVar1 = (fy_anchor *)(pfVar4->node).next;
            pfVar4 = (fy_anchor *)0x0;
            if (pfVar1 != (fy_anchor *)pfVar11) {
              pfVar4 = pfVar1;
            }
          } while (pfVar4 != (fy_anchor *)0x0);
        }
        if (pfVar8 != (fy_anchor *)0x0) {
          return pfVar8;
        }
        return pfVar12;
      }
    }
  }
  return (fy_anchor *)0x0;
}

Assistant:

struct fy_anchor *
fy_document_lookup_anchor_by_token(struct fy_document *fyd,
                                   struct fy_token *anchor) {
    struct fy_anchor *fya, *fya_found, *fya_found2;
    struct fy_anchor_list *fyal;
    const char *anchor_text, *text;
    size_t anchor_len, text_len;
    int count;

    if (!fyd || !anchor)
        return NULL;

    /* first try direct match (it's faster and the common case) */
    if (fy_document_is_accelerated(fyd)) {
        fya = fy_document_accel_lookup_anchor_by_token(fyd, anchor);
        if (!fya)
            return NULL;

        /* single anchor? return it */
        if (!fya->multiple)
            return fya;

        /* multiple anchors, fall-through */
    }

    anchor_text = fy_token_get_text(anchor, &anchor_len);
    if (!anchor_text)
        return NULL;

    fyal = &fyd->anchors;

    /* first pass, try with a single match */
    count = 0;
    fya_found = NULL;
    for (fya = fy_anchor_list_head(fyal); fya; fya = fy_anchor_next(fyal, fya)) {
        text = fy_anchor_get_text(fya, &text_len);
        if (!text)
            return NULL;

        if (anchor_len == text_len && !memcmp(anchor_text, text, anchor_len)) {
            count++;
            fya_found = fya;
        }
    }

    /* not found */
    if (!count)
        return NULL;

    /* single one? fine */
    if (count == 1)
        return fya_found;

    /* multiple ones, must pick the one that's the last one before
	 * the requesting token */
    /* fyd_notice(fyd, "multiple anchors for %.*s", (int)anchor_len, anchor_text); */

    /* only try the ones on the same input
	 * we don't try to cover the case where the label is referenced
	 * by other constructed documents
	 */
    fya_found2 = NULL;
    for (fya = fy_anchor_list_head(fyal); fya; fya = fy_anchor_next(fyal, fya)) {

        /* only on the same input */
        if (fy_token_get_input(fya->anchor) != fy_token_get_input(anchor))
            continue;

        text = fy_anchor_get_text(fya, &text_len);
        if (!text)
            return NULL;

        if (anchor_len == text_len && !memcmp(anchor_text, text, anchor_len) &&
            fy_token_start_pos(fya->anchor) < fy_token_start_pos(anchor)) {
            fya_found2 = fya;
        }
    }

    /* just return the one find earlier */
    if (!fya_found2)
        return fya_found;

    /* return the one that was the latest */
    return fya_found2;
}